

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_qabs_s32_aarch64(CPUARMState_conflict *env,uint32_t x)

{
  uint32_t local_14;
  uint32_t x_local;
  CPUARMState_conflict *env_local;
  
  if (x == 0x80000000) {
    (env->vfp).qc[0] = 1;
    local_14 = 0x7fffffff;
  }
  else {
    local_14 = x;
    if ((int)x < 0) {
      local_14 = -x;
    }
  }
  return local_14;
}

Assistant:

uint32_t HELPER(neon_qabs_s32)(CPUARMState *env, uint32_t x)
{
    if (x == SIGNBIT) {
        SET_QC();
        x = ~SIGNBIT;
    } else if ((int32_t)x < 0) {
#ifdef _MSC_VER
        x = 0 - x;
#else
        x = -x;
#endif
    }
    return x;
}